

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall QMainWindowLayout::plug(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  QMainWindowLayoutState *this_00;
  QPoint QVar1;
  undefined1 auVar2 [8];
  int *piVar3;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Representation RVar8;
  int iVar9;
  undefined4 extraout_var;
  QLayout *pQVar10;
  QWidget *pQVar11;
  QWidget *pQVar12;
  undefined4 extraout_var_00;
  QLayoutItem *pQVar13;
  QWidget *pQVar14;
  QDockWidgetLayout *this_01;
  QStyle *pQVar15;
  long lVar16;
  Representation RVar17;
  int iVar18;
  long lVar19;
  long in_FS_OFFSET;
  QList<QDockWidgetGroupWindow_*> list;
  QList<QDockWidgetGroupWindow_*> list_1;
  QPoint local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  QList<int> local_78;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) ||
     (*(long *)(this + 0x7f8) == 0)) {
    pQVar12 = QLayout::parentWidget((QLayout *)this);
    if ((pQVar12->data->widget_attributes & 0x8000) != 0) {
      pQVar12 = QLayout::parentWidget((QLayout *)this);
      bVar5 = QWidget::isMinimized(pQVar12);
      if ((!bVar5) && (*(long *)(this + 0x7c0) != 0)) {
        fixToolBarOrientation(widgetItem,*(int *)(*(long *)(this + 0x7b8) + 4));
        iVar7 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
        pQVar12 = (QWidget *)CONCAT44(extraout_var_00,iVar7);
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (int *)0x0;
        local_58.d.size = 0;
        qt_qFindChildren_helper
                  (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
                   &QDockWidgetGroupWindow::staticMetaObject,&local_58,0);
        piVar3 = local_58.d.ptr;
        if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
          lVar16 = local_58.d.size << 3;
          lVar19 = 0;
          do {
            pQVar14 = *(QWidget **)((long)piVar3 + lVar19);
            local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar10 = QWidget::layout(pQVar14);
            QDockAreaLayoutInfo::indexOf
                      (&local_78,(QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,pQVar12);
            if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
              pQVar10 = QWidget::layout(pQVar14);
              QDockAreaLayoutInfo::remove
                        ((QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,(char *)&local_78);
            }
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
              }
            }
            lVar19 = lVar19 + 8;
          } while (lVar16 != lVar19);
        }
        this_00 = (QMainWindowLayoutState *)(this + 0x88);
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        QMainWindowLayoutState::indexOf(&local_78,this_00,pQVar12);
        pQVar13 = QMainWindowLayoutState::plug(this_00,(QList<int> *)(this + 0x7b0));
        bVar5 = pQVar13 != (QLayoutItem *)0x0;
        if (bVar5) {
          if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
            QMainWindowLayoutState::remove(this_00,(char *)&local_78);
          }
          *(QWidget **)(this + 0x7d8) = pQVar12;
          local_98 = *(undefined1 (*) [8])(this + 0x7c8);
          uStack_90 = *(int **)(this + 2000);
          pQVar14 = QLayout::parentWidget((QLayout *)this);
          auVar2 = local_98;
          local_a0.xp.m_i = local_98._0_4_;
          local_a0.yp.m_i = local_98._4_4_;
          local_98 = (undefined1  [8])QWidget::mapToGlobal(pQVar14,&local_a0);
          RVar8.m_i = local_98._0_4_;
          iVar7 = (RVar8.m_i - auVar2._0_4_) + uStack_90._0_4_;
          RVar17.m_i = local_98._4_4_;
          iVar18 = (RVar17.m_i - auVar2._4_4_) + uStack_90._4_4_;
          uStack_90 = (int *)CONCAT44(iVar18,iVar7);
          lVar16 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
          if (lVar16 != 0) {
            QWidget::layout(pQVar12);
            this_01 = (QDockWidgetLayout *)
                      QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
            bVar6 = QDockWidgetLayout::nativeWindowDeco(this_01);
            if (bVar6) {
              iVar7 = QDockWidgetLayout::titleHeight(this_01);
              local_98._4_4_ = iVar7 + RVar17.m_i;
            }
            else {
              pQVar15 = QWidget::style(pQVar12);
              iVar9 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x12,0,pQVar12);
              local_98._4_4_ = RVar17.m_i - iVar9;
              local_98._0_4_ = RVar8.m_i - iVar9;
              uStack_90 = (int *)CONCAT44(iVar18 + iVar9,iVar7 + iVar9);
            }
          }
          QWidgetAnimator::animate
                    ((QWidgetAnimator *)(this + 0x790),pQVar12,(QRect *)local_98,
                     (bool)((byte)*(undefined4 *)(this + 0x700) & 1));
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
          }
        }
        goto LAB_00435e4e;
      }
    }
    bVar5 = false;
  }
  else {
    iVar7 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
    pQVar12 = (QWidget *)CONCAT44(extraout_var,iVar7);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QMainWindowLayoutState::indexOf(&local_58,(QMainWindowLayoutState *)(this + 0x88),pQVar12);
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      QMainWindowLayoutState::remove((QMainWindowLayoutState *)(this + 0x88),(char *)&local_58);
    }
    pQVar10 = QWidget::layout(*(QWidget **)(this + 0x7f8));
    QDockAreaLayoutInfo::indexOf
              (&local_78,(QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,pQVar12);
    pDVar4 = local_58.d.d;
    local_58.d.size = local_78.d.size;
    local_58.d.ptr = local_78.d.ptr;
    local_58.d.d = local_78.d.d;
    local_78.d.size = 0;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (int *)0x0;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,4,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
      }
    }
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (int *)0x0;
    local_78.d.size = 0;
    qt_qFindChildren_helper
              (*(undefined8 *)(*(long *)(this + 8) + 0x10),0,0,
               &QDockWidgetGroupWindow::staticMetaObject,&local_78,0);
    piVar3 = local_78.d.ptr;
    if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
      lVar16 = local_78.d.size << 3;
      lVar19 = 0;
      do {
        pQVar14 = *(QWidget **)((long)piVar3 + lVar19);
        if ((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) {
          pQVar11 = (QWidget *)0x0;
        }
        else {
          pQVar11 = *(QWidget **)(this + 0x7f8);
        }
        if (pQVar11 != pQVar14) {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          uStack_90 = (int *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar10 = QWidget::layout(pQVar14);
          QDockAreaLayoutInfo::indexOf
                    ((QList<int> *)local_98,(QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,
                     pQVar12);
          if (local_88 != (undefined1 *)0x0) {
            pQVar10 = QWidget::layout(pQVar14);
            QDockAreaLayoutInfo::remove
                      ((QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,(char *)local_98);
          }
          if ((QPoint)local_98 != (QPoint)0x0) {
            LOCK();
            *(int *)local_98 = *(int *)local_98 + -1;
            UNLOCK();
            if (*(int *)local_98 == 0) {
              QArrayData::deallocate((QArrayData *)local_98,4,0x10);
            }
          }
        }
        lVar19 = lVar19 + 8;
      } while (lVar16 != lVar19);
    }
    *(undefined8 *)(this + 0x7c8) = 0;
    *(undefined8 *)(this + 2000) = 0xffffffffffffffff;
    QDockWidgetGroupWindow::apply(*(QDockWidgetGroupWindow **)(this + 0x7f8));
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      pQVar10 = QWidget::layout(*(QWidget **)(this + 0x7f8));
      QDockAreaLayoutInfo::remove
                ((QDockAreaLayoutInfo *)&pQVar10[4].super_QLayoutItem,(char *)&local_58);
    }
    pQVar14 = *(QWidget **)(this + 0x7f8);
    QVar1 = *(QPoint *)(pQVar14 + 1);
    uStack_90 = *(int **)&pQVar14[1].field_0x8;
    local_a0 = QVar1;
    local_98 = (undefined1  [8])QVar1;
    local_98 = (undefined1  [8])QWidget::mapToGlobal(pQVar14,&local_a0);
    uStack_90 = (int *)CONCAT44(uStack_90._4_4_ + (local_98._4_4_ - QVar1.yp.m_i),
                                uStack_90._0_4_ + (local_98._0_4_ - QVar1.xp.m_i));
    *(QWidget **)(this + 0x7d8) = pQVar12;
    QWidgetAnimator::animate
              ((QWidgetAnimator *)(this + 0x790),pQVar12,(QRect *)local_98,
               (bool)((byte)*(undefined4 *)(this + 0x700) & 1));
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
      }
    }
    bVar5 = true;
  }
LAB_00435e4e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayout::plug(QLayoutItem *widgetItem)
{
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget) && QT_CONFIG(tabbar)
    if (currentHoveredFloat) {
        QWidget *widget = widgetItem->widget();
        QList<int> previousPath = layoutState.indexOf(widget);
        if (!previousPath.isEmpty())
            layoutState.remove(previousPath);
        previousPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
        // Let's remove the widget from any possible group window
        const auto groups =
                parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
        for (QDockWidgetGroupWindow *dwgw : groups) {
            if (dwgw == currentHoveredFloat)
                continue;
            QList<int> path = dwgw->layoutInfo()->indexOf(widget);
            if (!path.isEmpty())
                dwgw->layoutInfo()->remove(path);
        }
        currentGapRect = QRect();
        currentHoveredFloat->apply();
        if (!previousPath.isEmpty())
            currentHoveredFloat->layoutInfo()->remove(previousPath);
        QRect globalRect = currentHoveredFloat->currentGapRect;
        globalRect.moveTopLeft(currentHoveredFloat->mapToGlobal(globalRect.topLeft()));
        pluggingWidget = widget;
        widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);
        return true;
    }
#endif

    if (!parentWidget()->isVisible() || parentWidget()->isMinimized() || currentGapPos.isEmpty())
        return false;

    fixToolBarOrientation(widgetItem, currentGapPos.at(1));

    QWidget *widget = widgetItem->widget();

#if QT_CONFIG(dockwidget)
    // Let's remove the widget from any possible group window
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> path = dwgw->layoutInfo()->indexOf(widget);
        if (!path.isEmpty())
            dwgw->layoutInfo()->remove(path);
    }
#endif

    QList<int> previousPath = layoutState.indexOf(widget);

    const QLayoutItem *it = layoutState.plug(currentGapPos);
    if (!it)
        return false;
    Q_ASSERT(it == widgetItem);
    if (!previousPath.isEmpty())
        layoutState.remove(previousPath);

    pluggingWidget = widget;
    QRect globalRect = currentGapRect;
    globalRect.moveTopLeft(parentWidget()->mapToGlobal(globalRect.topLeft()));
#if QT_CONFIG(dockwidget)
    if (qobject_cast<QDockWidget*>(widget) != nullptr) {
        QDockWidgetLayout *layout = qobject_cast<QDockWidgetLayout*>(widget->layout());
        if (layout->nativeWindowDeco()) {
            globalRect.adjust(0, layout->titleHeight(), 0, 0);
        } else {
            int fw = widget->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, widget);
            globalRect.adjust(-fw, -fw, fw, fw);
        }
    }
#endif
    widgetAnimator.animate(widget, globalRect, dockOptions & QMainWindow::AnimatedDocks);

    return true;
}